

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProbeContainer.cpp
# Opt level: O2

bool __thiscall
Js::ProbeContainer::DispatchExceptionBreakpoint
          (ProbeContainer *this,InterpreterHaltState *pHaltState)

{
  code *pcVar1;
  InterpreterHaltState *pIVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  undefined4 *puVar6;
  Var pvVar7;
  FunctionBody *pFVar8;
  ScriptContext *pSVar9;
  DebugContext *pDVar10;
  ulong uVar11;
  undefined1 *local_58;
  ProbeContainer *local_50;
  int *local_48;
  undefined1 **local_40;
  undefined1 local_38;
  int local_2c;
  InterpreterHaltState *pIStack_28;
  int currentOffset;
  InterpreterHaltState *pHaltState_local;
  
  pIStack_28 = pHaltState;
  Output::Trace(DebuggerPhase,
                L"ProbeContainer::DispatchExceptionBreakpoint: start: this=%p, pHaltState=%p\n",this
                ,pHaltState);
  if (((this->haltCallbackProbe == (HaltCallback *)0x0) ||
      (iVar4 = (*this->haltCallbackProbe->_vptr_HaltCallback[3])(), (char)iVar4 != '\0')) ||
     (this->debugManager->isAtDispatchHalt == true)) {
    Output::Trace(DebuggerPhase,
                  L"ProbeContainer::DispatchExceptionBreakpoint: not in break mode: pHaltState=%p\n"
                  ,pHaltState);
    return false;
  }
  if (pHaltState->stopType != STOP_EXCEPTIONTHROW) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/ProbeContainer.cpp"
                                ,0x191,"(pHaltState->stopType == STOP_EXCEPTIONTHROW)",
                                "pHaltState->stopType == STOP_EXCEPTIONTHROW");
    if (!bVar3) goto LAB_007fd584;
    *puVar6 = 0;
  }
  pvVar7 = JavascriptExceptionObject::GetThrownObject
                     (pHaltState->exceptionObject,(ScriptContext *)0x0);
  this->jsExceptionObject = pvVar7;
  local_48 = &local_2c;
  local_2c = -1;
  local_58 = (undefined1 *)&stack0xffffffffffffffd8;
  local_40 = &local_58;
  local_38 = 1;
  local_50 = this;
  InitializeLocation(this,pHaltState,false);
  pIVar2 = pIStack_28;
  bVar3 = InterpreterHaltState::IsValid(pIStack_28);
  if (pIStack_28->topFrame == (DiagStackFrame *)0x0) {
    uVar11 = 0;
  }
  else {
    uVar5 = (*pIStack_28->topFrame->_vptr_DiagStackFrame[0xc])();
    uVar11 = (ulong)(uVar5 & 0xff);
  }
  Output::Trace(DebuggerPhase,
                L"ProbeContainer::DispatchExceptionBreakpoint: initialized location: pHaltState=%p, IsInterpreterFrame=%d\n"
                ,pIVar2,(ulong)bVar3,uVar11);
  bVar3 = InterpreterHaltState::IsValid(pIStack_28);
  if (bVar3) {
    pFVar8 = InterpreterHaltState::GetFunction(pIStack_28);
    pSVar9 = FunctionProxy::GetScriptContext((FunctionProxy *)pFVar8);
    bVar3 = ScriptContext::IsScriptContextInDebugMode(pSVar9);
    if (bVar3) {
      pFVar8 = InterpreterHaltState::GetFunction(pIStack_28);
      FunctionBody::MustBeInDebugMode(pFVar8);
      iVar4 = (*pIStack_28->topFrame->_vptr_DiagStackFrame[0xc])();
      if ((char)iVar4 != '\0') {
        local_2c = InterpreterHaltState::GetCurrentOffset(pIStack_28);
        if (local_2c < 1) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar6 = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/ProbeContainer.cpp"
                                      ,0x1ad,"(currentOffset > 0)","currentOffset > 0");
          if (!bVar3) {
LAB_007fd584:
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          *puVar6 = 0;
        }
        InterpreterHaltState::SetCurrentOffset(pIStack_28,local_2c + -1);
      }
      StepController::Deactivate(&this->debugManager->stepController,pIStack_28);
      AsyncBreakController::Deactivate(&this->debugManager->asyncBreakController);
      pFVar8 = InterpreterHaltState::GetFunction(pIStack_28);
      FunctionBody::CheckAndRegisterFuncToDiag(pFVar8,this->pScriptContext);
      pFVar8 = InterpreterHaltState::GetFunction(pIStack_28);
      pSVar9 = FunctionProxy::GetScriptContext((FunctionProxy *)pFVar8);
      pIVar2 = pIStack_28;
      if (pSVar9 != this->pScriptContext) {
        pDVar10 = ScriptContext::GetDebugContext(pSVar9);
        Output::Trace(DebuggerPhase,
                      L"ProbeContainer::DispatchExceptionBreakpoint: top function\'s context is different from the current context: pHaltState=%p, haltCallbackProbe=%p\n"
                      ,pIVar2,pDVar10->diagProbesContainer->haltCallbackProbe);
        pDVar10 = ScriptContext::GetDebugContext(pSVar9);
        if (pDVar10->diagProbesContainer->haltCallbackProbe == (HaltCallback *)0x0)
        goto LAB_007fd554;
        pDVar10 = ScriptContext::GetDebugContext(pSVar9);
        this = pDVar10->diagProbesContainer;
      }
      bVar3 = true;
      (*this->haltCallbackProbe->_vptr_HaltCallback[1])(this->haltCallbackProbe,pIStack_28);
      goto LAB_007fd556;
    }
  }
LAB_007fd554:
  bVar3 = false;
LAB_007fd556:
  local_38 = 0;
  anon_func::FinallyObject::~FinallyObject((FinallyObject *)&local_40);
  Output::Trace(DebuggerPhase,
                L"ProbeContainer::DispatchExceptionBreakpoint: end: pHaltState=%p, fSuccess=%d\n",
                pIStack_28,(ulong)bVar3);
  return bVar3;
}

Assistant:

bool ProbeContainer::DispatchExceptionBreakpoint(InterpreterHaltState* pHaltState)
    {
        OUTPUT_TRACE(Js::DebuggerPhase, _u("ProbeContainer::DispatchExceptionBreakpoint: start: this=%p, pHaltState=%p\n"), this, pHaltState);
        bool fSuccess = false;
        if (!haltCallbackProbe || haltCallbackProbe->IsInClosedState() || debugManager->IsAtDispatchHalt())
        {
            OUTPUT_TRACE(Js::DebuggerPhase, _u("ProbeContainer::DispatchExceptionBreakpoint: not in break mode: pHaltState=%p\n"), pHaltState);
            // Will not be able to handle multiple break-hits.
            return fSuccess;
        }

        Assert(pHaltState->stopType == STOP_EXCEPTIONTHROW);

        jsExceptionObject = pHaltState->exceptionObject->GetThrownObject(nullptr);

        // Will store current offset of the bytecode block.
        int currentOffset = -1;

        TryFinally([&]()
        {
            InitializeLocation(pHaltState, false);
            OUTPUT_TRACE(Js::DebuggerPhase, _u("ProbeContainer::DispatchExceptionBreakpoint: initialized location: pHaltState=%p, IsInterpreterFrame=%d\n"),
                pHaltState, pHaltState->IsValid(), pHaltState->topFrame && pHaltState->topFrame->IsInterpreterFrame());

            // The ByteCodeReader should be available at this point, but because of possibility of garbled frame, we shouldn't hit AV
            if (pHaltState->IsValid() && pHaltState->GetFunction()->GetScriptContext()->IsScriptContextInDebugMode())
            {
#if DBG
                pHaltState->GetFunction()->MustBeInDebugMode();
#endif

                // For interpreter frames, change the current location pointer of bytecode block, as it might be pointing to the next statement on the body.
                // In order to generated proper binding of break on exception to the statement, the bytecode offset needed to be on the same span
                // of the statement.
                // For native frames the offset is always current.
                // Move back a single byte to ensure that it falls under on the same statement.
                if (pHaltState->topFrame->IsInterpreterFrame())
                {
                    currentOffset = pHaltState->GetCurrentOffset();
                    Assert(currentOffset > 0);
                    pHaltState->SetCurrentOffset(currentOffset - 1);
                }

                // an inline breakpoint is being dispatched deactivate other stopping controllers
                debugManager->stepController.Deactivate(pHaltState);
                debugManager->asyncBreakController.Deactivate();

                pHaltState->GetFunction()->CheckAndRegisterFuncToDiag(pScriptContext);

                ScriptContext *pTopFuncContext = pHaltState->GetFunction()->GetScriptContext();

                // If the top function's context is different from the current context, that means current frame is not alive anymore and breaking here cannot not happen.
                // So in that case we will consider the top function's context and break on that context.
                if (pTopFuncContext != pScriptContext)
                {
                    OUTPUT_TRACE(Js::DebuggerPhase, _u("ProbeContainer::DispatchExceptionBreakpoint: top function's context is different from the current context: pHaltState=%p, haltCallbackProbe=%p\n"),
                        pHaltState, pTopFuncContext->GetDebugContext()->GetProbeContainer()->haltCallbackProbe);
                    if (pTopFuncContext->GetDebugContext()->GetProbeContainer()->haltCallbackProbe)
                    {
                        pTopFuncContext->GetDebugContext()->GetProbeContainer()->haltCallbackProbe->DispatchHalt(pHaltState);
                        fSuccess = true;
                    }
                }
                else
                {
                    haltCallbackProbe->DispatchHalt(pHaltState);
                    fSuccess = true;
                }
            }
        },
        [&](bool)
        {
            // If the next statement has changed, we need to log that to exception object so that it will not try to advance to next statement again.
            pHaltState->exceptionObject->SetIgnoreAdvanceToNextStatement(IsNextStatementChanged);

            // Restore the current offset;
            if (currentOffset != -1 && pHaltState->topFrame->IsInterpreterFrame())
            {
                pHaltState->SetCurrentOffset(currentOffset);
            }

            DestroyLocation();
        });

        OUTPUT_TRACE(Js::DebuggerPhase, _u("ProbeContainer::DispatchExceptionBreakpoint: end: pHaltState=%p, fSuccess=%d\n"), pHaltState, fSuccess);
        return fSuccess;
    }